

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O2

NamedPoint *
helics::ValueConverter<helics::NamedPoint>::interpret
          (NamedPoint *__return_storage_ptr__,data_view *block)

{
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->value = NAN;
  detail::convertFromBinary((byte *)(block->dblock)._M_str,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static X interpret(const data_view& block)
    {
        X val;
        detail::convertFromBinary(block.bytes(), val);
        return val;
    }